

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

IVal * deqp::gls::BuiltinPrecisionTests::
       ContainerTraits<tcu::Matrix<float,_3,_3>,_tcu::Matrix<tcu::Interval,_3,_3>_>::doConvert
                 (IVal *__return_storage_ptr__,FloatFormat *fmt,IVal *value)

{
  long lVar1;
  IVal *pIVar2;
  bool *pbVar3;
  long lVar4;
  byte bVar5;
  IVal local_70;
  
  bVar5 = 0;
  tcu::Matrix<tcu::Interval,_3,_3>::Matrix(__return_storage_ptr__);
  lVar4 = 0;
  do {
    ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
              (&local_70,fmt,(IVal *)(&(value->m_data).m_data[0].m_data[0].m_hasNaN + lVar4));
    pIVar2 = &local_70;
    pbVar3 = &(__return_storage_ptr__->m_data).m_data[0].m_data[0].m_hasNaN + lVar4;
    for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined8 *)pbVar3 = *(undefined8 *)pIVar2->m_data;
      pIVar2 = (IVal *)((long)pIVar2 + ((ulong)bVar5 * -2 + 1) * 8);
      pbVar3 = pbVar3 + ((ulong)bVar5 * -2 + 1) * 8;
    }
    lVar4 = lVar4 + 0x48;
  } while (lVar4 != 0xd8);
  return __return_storage_ptr__;
}

Assistant:

static IVal			doConvert		(const FloatFormat& fmt, const IVal& value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = convert<Element>(fmt, value[ndx]);

		return ret;
	}